

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_3537c6::LiteralOperator::printLeft(LiteralOperator *this,OutputStream *S)

{
  Node *pNVar1;
  
  OutputStream::grow(S,0xb);
  builtin_strncpy(S->Buffer + S->CurrentPosition,"operator\"\" ",0xb);
  S->CurrentPosition = S->CurrentPosition + 0xb;
  pNVar1 = this->OpName;
  (*pNVar1->_vptr_Node[4])(pNVar1,S);
  if (pNVar1->RHSComponentCache == No) {
    return;
  }
  (*pNVar1->_vptr_Node[5])(pNVar1,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "operator\"\" ";
    OpName->print(S);
  }